

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall
wallet::LegacyScriptPubKeyMan::ReturnDestination
          (LegacyScriptPubKeyMan *this,int64_t nIndex,bool fInternal,CTxDestination *param_4)

{
  long lVar1;
  bool bVar2;
  mapped_type *__k;
  mapped_type *pmVar3;
  ConstevalFormatString<1U> in_RCX;
  byte in_DL;
  map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_> *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar4;
  CKeyID *pubkey_id;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock44;
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  *in_stack_ffffffffffffff18;
  key_type_conflict4 *in_stack_ffffffffffffff20;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_ffffffffffffff28;
  key_type_conflict4 *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  char *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  _Rb_tree_const_iterator<long> in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff58,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
             ,(char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff38 >> 0x18,0));
  if ((in_DL & 1) == 0) {
    bVar2 = std::set<long,_std::less<long>,_std::allocator<long>_>::empty
                      ((set<long,_std::less<long>,_std::allocator<long>_> *)
                       in_stack_ffffffffffffff18);
    if (bVar2) {
      pVar4 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff47 = pVar4.second;
    }
    else {
      std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    }
  }
  else {
    pVar4 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                      (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    in_stack_ffffffffffffff68 = pVar4.first._M_node;
    in_stack_ffffffffffffff67 = pVar4.second;
  }
  __k = std::map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>::at
                  ((map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
  pmVar3 = std::
           map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
           operator[]((map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                       *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__k);
  *pmVar3 = (mapped_type)in_RSI;
  std::map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>::erase
            (in_RSI,in_stack_ffffffffffffff20);
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(in_stack_ffffffffffffff18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff18);
  ScriptPubKeyMan::WalletLogPrintf<long>
            ((ScriptPubKeyMan *)in_stack_ffffffffffffff68._M_node,in_RCX,
             (long *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void LegacyScriptPubKeyMan::ReturnDestination(int64_t nIndex, bool fInternal, const CTxDestination&)
{
    // Return to key pool
    {
        LOCK(cs_KeyStore);
        if (fInternal) {
            setInternalKeyPool.insert(nIndex);
        } else if (!set_pre_split_keypool.empty()) {
            set_pre_split_keypool.insert(nIndex);
        } else {
            setExternalKeyPool.insert(nIndex);
        }
        CKeyID& pubkey_id = m_index_to_reserved_key.at(nIndex);
        m_pool_key_to_index[pubkey_id] = nIndex;
        m_index_to_reserved_key.erase(nIndex);
        NotifyCanGetAddressesChanged();
    }
    WalletLogPrintf("keypool return %d\n", nIndex);
}